

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O3

immutable_string __thiscall
ut::test_case_impl<agge::tests::VectorRasterizerTests>::fixture_name
          (test_case_impl<agge::tests::VectorRasterizerTests> *this)

{
  undefined1 *puVar1;
  _func_int **__dest;
  DeleterF extraout_RDX;
  DeleterF extraout_RDX_00;
  DeleterF extraout_RDX_01;
  DeleterF p_Var2;
  immutable_string iVar3;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"VectorRasterizerTests","");
  __dest = (_func_int **)operator_new__(local_40 + 1);
  puVar1 = local_48;
  (this->super_test_case).super_destructible._vptr_destructible = __dest;
  p_Var2 = extraout_RDX;
  if (local_40 != 0) {
    memmove(__dest,local_48,local_40);
    p_Var2 = extraout_RDX_00;
  }
  *(undefined1 *)((long)__dest + local_40) = 0;
  this->_method = (method_t)exportable::immutable_basic_string<char>::deallocate;
  if (puVar1 != local_38) {
    operator_delete(puVar1);
    p_Var2 = extraout_RDX_01;
  }
  iVar3._deleter = p_Var2;
  iVar3._text = (char *)this;
  return iVar3;
}

Assistant:

inline exportable::immutable_string test_case_impl<Fixture>::fixture_name() const
	{	return std::string(Fixture::__suite_name());	}